

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O1

CustomTabulated *
TasGrid::getShiftedExoticQuadrature
          (CustomTabulated *__return_storage_ptr__,int n,double shift,
          vector<double,_std::allocator<double>_> *shifted_weights,
          vector<double,_std::allocator<double>_> *ref_points,char *description,bool is_symmetric)

{
  vector<double,std::allocator<double>> *pvVar1;
  pointer pcVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  iterator iVar6;
  int iVar7;
  CustomTabulated *this;
  double *w;
  double *pdVar8;
  pointer *ppdVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  undefined7 in_register_00000089;
  ulong uVar13;
  long lVar14;
  size_type __n;
  ulong in_XMM0_Qb;
  vector<int,_std::allocator<int>_> num_nodes;
  vector<double,_std::allocator<double>_> correction_points;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  points_cache;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  weights_cache;
  vector<int,_std::allocator<int>_> precision;
  allocator<char> local_109;
  vector<int,_std::allocator<int>_> local_108;
  string local_e8;
  int local_c0;
  undefined4 local_bc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_b8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_98;
  double local_78;
  ulong uStack_70;
  vector<int,_std::allocator<int>_> local_60;
  char *local_48;
  CustomTabulated *local_40;
  ulong local_38;
  
  uVar11 = (ulong)(uint)n;
  local_78 = shift;
  if ((long)(shifted_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(shifted_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start !=
      (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(ref_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    __assert_fail("shifted_weights.size() == ref_points.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/tsgExoticQuadrature.hpp"
                  ,0xed,
                  "TasGrid::CustomTabulated TasGrid::getShiftedExoticQuadrature(const int, const double, const std::vector<double> &, const std::vector<double> &, const char *, const bool)"
                 );
  }
  local_b8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bc = (undefined4)CONCAT71(in_register_00000089,is_symmetric);
  uStack_70 = in_XMM0_Qb;
  local_48 = description;
  local_40 = __return_storage_ptr__;
  if (is_symmetric) {
    getGaussNodesAndWeights<true>(n,ref_points,shifted_weights,&local_b8,&local_98);
  }
  else {
    getGaussNodesAndWeights<false>(n,ref_points,shifted_weights,&local_b8,&local_98);
  }
  local_c0 = n;
  if (0 < n && local_78 != 0.0) {
    local_78 = -local_78;
    uStack_70 = uStack_70 ^ 0x8000000000000000;
    uVar13 = 0;
    local_38 = uVar11;
    do {
      pdVar3 = local_b8.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = local_b8.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      lVar14 = (long)pdVar4 - (long)pdVar3 >> 3;
      local_e8.field_2._M_allocated_capacity = 0;
      local_e8._M_dataplus._M_p = (pointer)0x0;
      local_e8._M_string_length = 0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      TasGrid::OneDimensionalNodes::getGaussLegendre
                ((int)lVar14,(vector *)&local_108,(vector *)&local_e8);
      for (pdVar8 = (double *)
                    local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar8 != (double *)
                    local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
        *pdVar8 = *pdVar8 * local_78;
      }
      if (((byte)local_bc &
          (byte)((local_e8._M_string_length - (long)local_e8._M_dataplus._M_p & 0xffffffff) >> 3) &
          0x1f) != 0) {
        pcVar2 = local_e8._M_dataplus._M_p +
                 ((long)(local_e8._M_string_length - (long)local_e8._M_dataplus._M_p) >> 1) + -4;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
      }
      if ((pointer)local_e8._M_string_length != local_e8._M_dataplus._M_p) {
        uVar11 = 0;
        do {
          lVar10 = -1;
          if (pdVar4 != pdVar3) {
            lVar12 = 0;
            do {
              lVar10 = lVar12;
              if (ABS(*(double *)(local_e8._M_dataplus._M_p + uVar11 * 8) -
                      local_b8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar13].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12]) <= 1e-12) break;
              lVar12 = lVar12 + 1;
              lVar10 = -1;
            } while (lVar14 + (ulong)(lVar14 == 0) != lVar12);
          }
          if (lVar10 == -1) {
            pvVar1 = (vector<double,std::allocator<double>> *)
                     (local_b8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13);
            iVar6._M_current = *(double **)(pvVar1 + 8);
            if (iVar6._M_current == *(double **)(pvVar1 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvVar1,iVar6,(double *)(local_e8._M_dataplus._M_p + uVar11 * 8));
            }
            else {
              *iVar6._M_current = *(double *)(local_e8._M_dataplus._M_p + uVar11 * 8);
              *(double **)(pvVar1 + 8) = iVar6._M_current + 1;
            }
            pvVar1 = (vector<double,std::allocator<double>> *)
                     (local_98.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13);
            iVar6._M_current = *(double **)(pvVar1 + 8);
            if (iVar6._M_current == *(double **)(pvVar1 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvVar1,iVar6,
                         (double *)
                         ((long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar11 * 8));
            }
            else {
              *iVar6._M_current =
                   *(double *)
                    ((long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar11 * 8);
              *(double **)(pvVar1 + 8) = iVar6._M_current + 1;
            }
          }
          else {
            pdVar5 = local_98.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5[lVar10] =
                 *(double *)
                  ((long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar11 * 8) + pdVar5[lVar10];
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)(local_e8._M_string_length - (long)local_e8._M_dataplus._M_p
                                        ) >> 3));
      }
      if ((double *)
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (double *)0x0) {
        operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar11 = local_38;
      if (local_e8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_e8._M_dataplus._M_p,
                        local_e8.field_2._M_allocated_capacity - (long)local_e8._M_dataplus._M_p);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar11);
  }
  iVar7 = local_c0;
  __n = (size_type)local_c0;
  std::vector<int,_std::allocator<int>_>::vector(&local_108,__n,(allocator_type *)&local_e8);
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__n,(allocator_type *)&local_e8);
  this = local_40;
  if (0 < iVar7) {
    ppdVar9 = &((local_b8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
    lVar14 = 0;
    do {
      *(int *)((long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar14 * 2) =
           (int)((ulong)((long)*ppdVar9 - (long)((_Vector_impl_data *)(ppdVar9 + -1))->_M_start) >>
                3);
      *(int *)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar14 * 2) = (int)lVar14 + 1;
      ppdVar9 = ppdVar9 + 3;
      lVar14 = lVar14 + 2;
    } while (uVar11 * 2 != lVar14);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,local_48,&local_109);
  CustomTabulated::CustomTabulated(this,&local_108,&local_60,&local_b8,&local_98,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((double *)
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_b8);
  return this;
}

Assistant:

inline TasGrid::CustomTabulated getShiftedExoticQuadrature(const int n, const double shift, const std::vector<double> &shifted_weights,
                                                           const std::vector<double> &ref_points, const char* description,
                                                           const bool is_symmetric = false) {
    // Create the set of points (roots) and weights for the first term.
    assert(shifted_weights.size() == ref_points.size());
    std::vector<std::vector<double>> points_cache, weights_cache;
    if (is_symmetric) {
        getGaussNodesAndWeights<true>(n, ref_points, shifted_weights, points_cache, weights_cache);
    } else {
        getGaussNodesAndWeights<false>(n, ref_points, shifted_weights, points_cache, weights_cache);
    }

    // Create and append the set of correction points and weights for the second term only if the shift is nonzero.
    if (shift != 0.0) {
        for (int i=0; i<n; i++) {
            const size_t init_size = points_cache[i].size();
            std::vector<double> correction_points, correction_weights;
            TasGrid::OneDimensionalNodes::getGaussLegendre(static_cast<int>(init_size), correction_weights, correction_points);
            for (auto &w : correction_weights) w *= -shift;
            if (correction_points.size() % 2 == 1 && is_symmetric) {
                // Zero out for stability.
                correction_points[(correction_points.size() - 1) / 2] = 0.0;
            }
            // Account for duplicates up to a certain tolerance.
            for (size_t j=0; j<correction_points.size(); j++) {
                long long nonunique_idx = -1;
                for (size_t k=0; k<init_size; k++) {
                    if (std::abs(correction_points[j] - points_cache[i][k]) <= Maths::num_tol) {
                        nonunique_idx = static_cast<long long>(k);
                        break;
                    }
                }
                if (nonunique_idx == -1) {
                    points_cache[i].push_back(correction_points[j]);
                    weights_cache[i].push_back(correction_weights[j]);
                } else {
                    weights_cache[i][nonunique_idx] += correction_weights[j];
                }
            }
        }
    }

    // Output to a CustomTabulated instance.
    std::vector<int> num_nodes(n), precision(n);
    for (int i=0; i<n; i++) {
        num_nodes[i] = static_cast<int>(points_cache[i].size());
        precision[i] = 2 * (i + 1) - 1;
    }
    return TasGrid::CustomTabulated(std::move(num_nodes), std::move(precision), std::move(points_cache), std::move(weights_cache),
                                    description);
}